

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastV64R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  ParseContext *extraout_RDX;
  ParseContext *ctx_00;
  char *pcVar6;
  RepeatedField<unsigned_long> *this;
  uint *puVar7;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  this = (RepeatedField<unsigned_long> *)
         ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  cVar1 = *ptr;
  ctx_00 = ctx;
  do {
    pcVar6 = (char *)(long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                            limit_end_ + 1);
    if ((long)pcVar6 < 0) {
      uVar5 = (long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ +
                             2) << 7 | 0x7f;
      if ((long)uVar5 < 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                               limit_end_ + 3) << 0xe | 0x3fff);
        if ((long)data.field_0 < 0) {
          uVar5 = uVar5 & ((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                                  limit_end_ + 4) << 0x15 | 0x1fffffU);
          if ((long)uVar5 < 0) {
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           ((ulong)data.field_0 &
                           ((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream)
                                                   .limit_end_ + 5) << 0x1c | 0xfffffffU));
            if ((long)data.field_0 < 0) {
              uVar5 = uVar5 & ((long)*(char *)((long)&(((ParseContext *)ptr)->
                                                      super_EpsCopyInputStream).limit_end_ + 6) <<
                               0x23 | 0x7ffffffffU);
              if ((long)uVar5 < 0) {
                data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                               ((ulong)data.field_0 &
                               ((long)*(char *)((long)&(((ParseContext *)ptr)->
                                                       super_EpsCopyInputStream).limit_end_ + 7) <<
                                0x2a | 0x3ffffffffffU));
                if ((long)data.field_0 < 0) {
                  uVar5 = uVar5 & ((long)*(char *)&(((ParseContext *)ptr)->super_EpsCopyInputStream)
                                                   .buffer_end_ << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar5 < 0) {
                    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                                   ((ulong)data.field_0 &
                                   ((ulong)*(byte *)((long)&(((ParseContext *)ptr)->
                                                            super_EpsCopyInputStream).buffer_end_ +
                                                    1) << 0x38 | 0xffffffffffffff));
                    if ((long)data.field_0 < 0) {
                      ctx_00 = (ParseContext *)
                               ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_
                               + 3);
                      if (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                           buffer_end_ + 2) != '\x01') {
                        bVar2 = *(byte *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                                 buffer_end_ + 2);
                        if ((char)bVar2 < '\0') {
                          ptr = (char *)0x0;
                          goto LAB_00295638;
                        }
                        if ((bVar2 & 1) == 0) {
                          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                                         ((ulong)data.field_0 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      ctx_00 = (ParseContext *)
                               ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_
                               + 2);
                    }
                  }
                  else {
                    ctx_00 = (ParseContext *)
                             ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_ +
                             1);
                  }
                }
                else {
                  ctx_00 = (ParseContext *)
                           &(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_;
                }
              }
              else {
                ctx_00 = (ParseContext *)
                         ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 7);
              }
            }
            else {
              ctx_00 = (ParseContext *)
                       ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 6);
            }
          }
          else {
            ctx_00 = (ParseContext *)
                     ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 5);
          }
        }
        else {
          ctx_00 = (ParseContext *)
                   ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 4);
        }
        uVar5 = uVar5 & (ulong)data.field_0;
        ptr = (char *)ctx_00;
      }
      else {
        ptr = (char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 3);
      }
      pcVar6 = (char *)((ulong)pcVar6 & uVar5);
    }
    else {
      ptr = (char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 2);
    }
LAB_00295638:
    if ((ParseContext *)ptr == (ParseContext *)0x0) {
      pcVar6 = Error(msg,pcVar6,ctx_00,data,table,hasbits);
      return pcVar6;
    }
    RepeatedField<unsigned_long>::Add(this,(unsigned_long)pcVar6);
    if ((ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar7 & 3) != 0) {
          AlignFail(puVar7);
        }
        *puVar7 = *puVar7 | (uint)hasbits;
      }
      return (char *)(ParseContext *)ptr;
    }
    ctx_00 = extraout_RDX;
    if (*(char *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ != cVar1) {
      uVar3 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
      uVar4 = (uint)table->fast_idx_mask & (uint)uVar3;
      if ((uVar4 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar5 = (ulong)(uVar4 & 0xfffffff8);
      pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                                 (msg,ptr,ctx,
                                  (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),
                                  table,hasbits);
      return pcVar6;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV64R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<uint64_t, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}